

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O0

void embree::instanceIntersectFunc(RTCIntersectFunctionNArguments *args)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 *in_RDI;
  Vec3fa dir;
  Vec3fa org;
  RTCRay xray;
  float ray_tfar;
  float ray_tnear;
  Vec3ff ray_dir;
  Vec3ff ray_org;
  Instance *instance;
  Ray *ray;
  RTCRayHitN *rays;
  void *ptr;
  int *valid;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined1 local_868 [16];
  undefined8 local_858;
  undefined8 uStack_850;
  undefined1 local_848 [16];
  float local_838;
  float local_834;
  float local_830;
  undefined4 local_82c;
  float local_828;
  float local_824;
  float local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  long local_7d8;
  undefined8 *local_7d0;
  undefined8 *local_7c8;
  long local_7c0;
  int *local_7b8;
  undefined1 local_7a8 [16];
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined1 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined1 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined1 *local_6f0;
  undefined8 *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d0;
  float local_6c4;
  undefined8 *local_6c0;
  float local_6b4;
  undefined8 *local_6b0;
  undefined1 local_6a8 [16];
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined1 *local_650;
  undefined8 *local_648;
  undefined1 *local_640;
  float local_634;
  undefined8 *local_630;
  float local_624;
  undefined8 *local_620;
  undefined1 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined1 *local_5d8;
  undefined8 *local_5d0;
  undefined1 *local_5c8;
  undefined8 *local_5c0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined8 *local_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4dc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 *local_4a0;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined1 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined1 *local_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 *local_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined1 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined1 *local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 *local_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_150;
  undefined8 *local_148;
  undefined8 *local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined1 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  undefined1 *local_58;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar1 = local_858;
  uVar9 = local_878;
  local_708 = (undefined1 *)&local_878;
  local_5d8 = (undefined1 *)&local_878;
  local_6f0 = (undefined1 *)&local_878;
  local_650 = (undefined1 *)&local_878;
  local_7b8 = (int *)*in_RDI;
  local_7d8 = in_RDI[1];
  local_7d0 = (undefined8 *)in_RDI[4];
  if (*local_7b8 != 0) {
    local_730 = &local_7e8;
    local_608 = *local_7d0;
    uStack_600 = local_7d0[1];
    local_728 = local_7d0 + 2;
    local_720 = &local_7f8;
    local_5e8 = *local_728;
    uStack_5e0 = local_7d0[3];
    local_82c = *(undefined4 *)((long)local_7d0 + 0xc);
    local_818 = *(undefined4 *)(local_7d0 + 4);
    local_748 = (undefined8 *)(local_7d8 + 0x60);
    local_750 = &local_858;
    local_740 = local_848;
    local_858._0_4_ = (float)local_608;
    local_6b4 = (float)local_858;
    local_6b0 = &local_768;
    local_1f8 = CONCAT44((float)local_858,(float)local_858);
    uStack_1f0 = CONCAT44((float)local_858,(float)local_858);
    local_858._4_4_ = SUB84(uVar1,4);
    local_6c4 = local_858._4_4_;
    local_6c0 = &local_788;
    local_108 = CONCAT44(local_858._4_4_,local_858._4_4_);
    uStack_100 = CONCAT44(local_858._4_4_,local_858._4_4_);
    local_1c8 = (undefined8 *)(local_7d8 + 0x70);
    local_6d0 = local_7a8;
    local_d8 = (undefined8 *)(local_7d8 + 0x80);
    local_e0 = (undefined8 *)(local_7d8 + 0x90);
    local_1d0 = &local_798;
    local_b8 = &local_f8;
    uVar1 = *local_d8;
    uVar2 = *(undefined8 *)(local_7d8 + 0x88);
    local_28._0_4_ = (float)uVar1;
    local_28._4_4_ = (float)((ulong)uVar1 >> 0x20);
    uStack_20._0_4_ = (float)uVar2;
    uStack_20._4_4_ = (float)((ulong)uVar2 >> 0x20);
    local_48 = (float)uStack_850 * (float)local_28;
    fStack_44 = (float)uStack_850 * local_28._4_4_;
    fStack_40 = (float)uStack_850 * (float)uStack_20;
    fStack_3c = (float)uStack_850 * uStack_20._4_4_;
    local_78 = CONCAT44(fStack_44,local_48);
    uStack_70 = CONCAT44(fStack_3c,fStack_40);
    uVar3 = *local_e0;
    uVar4 = *(undefined8 *)(local_7d8 + 0x98);
    local_88._0_4_ = (float)uVar3;
    local_88._4_4_ = (float)((ulong)uVar3 >> 0x20);
    uStack_80._0_4_ = (float)uVar4;
    uStack_80._4_4_ = (float)((ulong)uVar4 >> 0x20);
    local_a8 = local_48 + (float)local_88;
    fStack_a4 = fStack_44 + local_88._4_4_;
    fStack_a0 = fStack_40 + (float)uStack_80;
    fStack_9c = fStack_3c + uStack_80._4_4_;
    local_2c0 = &local_778;
    local_1a8 = &local_1e8;
    uVar5 = *local_1c8;
    uVar6 = *(undefined8 *)(local_7d8 + 0x78);
    local_118._0_4_ = (float)uVar5;
    local_118._4_4_ = (float)((ulong)uVar5 >> 0x20);
    uStack_110._0_4_ = (float)uVar6;
    uStack_110._4_4_ = (float)((ulong)uVar6 >> 0x20);
    local_138 = local_858._4_4_ * (float)local_118;
    fStack_134 = local_858._4_4_ * local_118._4_4_;
    fStack_130 = local_858._4_4_ * (float)uStack_110;
    fStack_12c = local_858._4_4_ * uStack_110._4_4_;
    local_168 = CONCAT44(fStack_134,local_138);
    uStack_160 = CONCAT44(fStack_12c,fStack_130);
    local_178 = (float)local_798;
    fStack_174 = (float)((ulong)local_798 >> 0x20);
    fStack_170 = (float)uStack_790;
    fStack_16c = (float)((ulong)uStack_790 >> 0x20);
    local_198 = local_138 + local_178;
    fStack_194 = fStack_134 + fStack_174;
    fStack_190 = fStack_130 + fStack_170;
    fStack_18c = fStack_12c + fStack_16c;
    local_298 = &local_2d8;
    uVar7 = *local_748;
    uVar8 = *(undefined8 *)(local_7d8 + 0x68);
    local_208._0_4_ = (float)uVar7;
    local_208._4_4_ = (float)((ulong)uVar7 >> 0x20);
    uStack_200._0_4_ = (float)uVar8;
    uStack_200._4_4_ = (float)((ulong)uVar8 >> 0x20);
    local_228 = (float)local_858 * (float)local_208;
    fStack_224 = (float)local_858 * local_208._4_4_;
    fStack_220 = (float)local_858 * (float)uStack_200;
    fStack_21c = (float)local_858 * uStack_200._4_4_;
    local_258 = CONCAT44(fStack_224,local_228);
    uStack_250 = CONCAT44(fStack_21c,fStack_220);
    local_268 = (float)local_778;
    fStack_264 = (float)((ulong)local_778 >> 0x20);
    fStack_260 = (float)uStack_770;
    fStack_25c = (float)((ulong)uStack_770 >> 0x20);
    local_838 = local_228 + local_268;
    local_834 = fStack_224 + fStack_264;
    local_830 = fStack_220 + fStack_260;
    fStack_27c = fStack_21c + fStack_25c;
    local_6e8 = (undefined8 *)(local_7d8 + 0x60);
    local_6e0 = local_868;
    local_878._0_4_ = (float)local_5e8;
    local_634 = (float)local_878;
    local_630 = &local_668;
    local_3d8 = CONCAT44((float)local_878,(float)local_878);
    uStack_3d0 = CONCAT44((float)local_878,(float)local_878);
    local_878._4_4_ = SUB84(uVar9,4);
    local_624 = local_878._4_4_;
    local_620 = &local_688;
    local_2e8 = CONCAT44(local_878._4_4_,local_878._4_4_);
    uStack_2e0 = CONCAT44(local_878._4_4_,local_878._4_4_);
    local_3a8 = (undefined8 *)(local_7d8 + 0x70);
    local_610 = local_6a8;
    local_5d0 = (undefined8 *)(local_7d8 + 0x80);
    local_5c0 = &local_698;
    local_5c8 = local_6a8;
    uVar9 = *local_5d0;
    uVar10 = *(undefined8 *)(local_7d8 + 0x88);
    local_598._0_4_ = (float)uVar9;
    local_598._4_4_ = (float)((ulong)uVar9 >> 0x20);
    uStack_590._0_4_ = (float)uVar10;
    uStack_590._4_4_ = (float)((ulong)uVar10 >> 0x20);
    local_5b8 = (float)uStack_870 * (float)local_598;
    fStack_5b4 = (float)uStack_870 * local_598._4_4_;
    fStack_5b0 = (float)uStack_870 * (float)uStack_590;
    fStack_5ac = (float)uStack_870 * uStack_590._4_4_;
    local_5a0 = &local_698;
    local_398 = &local_678;
    local_3a0 = &local_688;
    local_3b0 = &local_698;
    local_320 = &local_3c8;
    uVar11 = *local_3a8;
    uVar12 = *(undefined8 *)(local_7d8 + 0x78);
    local_2f8._0_4_ = (float)uVar11;
    local_2f8._4_4_ = (float)((ulong)uVar11 >> 0x20);
    uStack_2f0._0_4_ = (float)uVar12;
    uStack_2f0._4_4_ = (float)((ulong)uVar12 >> 0x20);
    local_318 = local_878._4_4_ * (float)local_2f8;
    fStack_314 = local_878._4_4_ * local_2f8._4_4_;
    fStack_310 = local_878._4_4_ * (float)uStack_2f0;
    fStack_30c = local_878._4_4_ * uStack_2f0._4_4_;
    local_300 = &local_3c8;
    local_348 = CONCAT44(fStack_314,local_318);
    uStack_340 = CONCAT44(fStack_30c,fStack_310);
    local_380 = &local_678;
    local_388 = &local_3c8;
    local_358 = (float)local_698;
    fStack_354 = (float)((ulong)local_698 >> 0x20);
    fStack_350 = (float)uStack_690;
    fStack_34c = (float)((ulong)uStack_690 >> 0x20);
    local_378 = local_318 + local_358;
    fStack_374 = fStack_314 + fStack_354;
    fStack_370 = fStack_310 + fStack_350;
    fStack_36c = fStack_30c + fStack_34c;
    local_360 = &local_678;
    local_488 = local_868;
    local_490 = &local_668;
    local_4a0 = &local_678;
    local_410 = &local_4b8;
    uVar13 = *local_6e8;
    uVar14 = *(undefined8 *)(local_7d8 + 0x68);
    local_3e8._0_4_ = (float)uVar13;
    local_3e8._4_4_ = (float)((ulong)uVar13 >> 0x20);
    uStack_3e0._0_4_ = (float)uVar14;
    uStack_3e0._4_4_ = (float)((ulong)uVar14 >> 0x20);
    local_438 = (float)local_878 * (float)local_3e8;
    fStack_434 = (float)local_878 * local_3e8._4_4_;
    fStack_430 = (float)local_878 * (float)uStack_3e0;
    fStack_42c = (float)local_878 * uStack_3e0._4_4_;
    local_3f0 = &local_4b8;
    local_4b8 = CONCAT44(fStack_434,local_438);
    uStack_4b0 = CONCAT44(fStack_42c,fStack_430);
    local_470 = local_868;
    local_478 = &local_4b8;
    local_448 = (float)local_678;
    fStack_444 = (float)((ulong)local_678 >> 0x20);
    fStack_440 = (float)uStack_670;
    fStack_43c = (float)((ulong)uStack_670 >> 0x20);
    local_828 = local_438 + local_448;
    local_824 = fStack_434 + fStack_444;
    local_820 = fStack_430 + fStack_440;
    fStack_45c = fStack_42c + fStack_43c;
    local_450 = local_868;
    local_81c = 0;
    local_814 = 0xffffffff;
    local_810 = 0;
    local_80c = 0;
    local_800 = local_818;
    local_7fc = local_82c;
    local_7c8 = local_7d0;
    local_7c0 = local_7d8;
    local_738 = local_7d0;
    local_718 = local_7d0;
    local_710 = local_720;
    local_700 = local_730;
    local_6f8 = local_750;
    local_648 = local_6e8;
    local_640 = local_6e0;
    local_5f0 = local_750;
    local_598 = uVar9;
    uStack_590 = uVar10;
    local_558 = local_624;
    fStack_554 = local_624;
    fStack_550 = local_624;
    fStack_54c = local_624;
    local_53c = local_624;
    local_538 = local_634;
    fStack_534 = local_634;
    fStack_530 = local_634;
    fStack_52c = local_634;
    local_51c = local_634;
    local_518 = local_6b4;
    fStack_514 = local_6b4;
    fStack_510 = local_6b4;
    fStack_50c = local_6b4;
    local_4fc = local_6b4;
    local_4f8 = local_6c4;
    fStack_4f4 = local_6c4;
    fStack_4f0 = local_6c4;
    fStack_4ec = local_6c4;
    local_4dc = local_6c4;
    local_498 = local_6e8;
    local_480 = local_4a0;
    local_468 = local_828;
    fStack_464 = local_824;
    fStack_460 = local_820;
    local_420 = local_6e8;
    local_418 = local_490;
    local_408 = local_438;
    fStack_404 = fStack_434;
    fStack_400 = fStack_430;
    fStack_3fc = fStack_42c;
    local_3e8 = uVar13;
    uStack_3e0 = uVar14;
    local_390 = local_3b0;
    local_330 = local_3a8;
    local_328 = local_3a0;
    local_2f8 = uVar11;
    uStack_2f0 = uVar12;
    local_2b8 = local_748;
    local_2b0 = local_6b0;
    local_2a8 = local_740;
    local_2a0 = local_2c0;
    local_290 = local_740;
    local_288 = local_838;
    fStack_284 = local_834;
    fStack_280 = local_830;
    local_270 = local_740;
    local_240 = local_748;
    local_238 = local_6b0;
    local_230 = local_298;
    local_210 = local_298;
    local_208 = uVar7;
    uStack_200 = uVar8;
    local_1c0 = local_6c0;
    local_1b8 = local_2c0;
    local_1b0 = local_1d0;
    local_1a0 = local_2c0;
    local_180 = local_2c0;
    local_150 = local_1c8;
    local_148 = local_6c0;
    local_140 = local_1a8;
    local_120 = local_1a8;
    local_118 = uVar5;
    uStack_110 = uVar6;
    local_d0 = local_6d0;
    local_c8 = local_1d0;
    local_c0 = local_e0;
    local_b0 = local_1d0;
    local_90 = local_1d0;
    local_88 = uVar3;
    uStack_80 = uVar4;
    local_60 = local_d8;
    local_58 = local_6d0;
    local_50 = local_b8;
    local_30 = local_b8;
    local_28 = uVar1;
    uStack_20 = uVar2;
    local_878 = local_5e8;
    uStack_870 = uStack_5e0;
    local_858 = local_608;
    uStack_850 = uStack_600;
    local_7f8 = local_5e8;
    uStack_7f0 = uStack_5e0;
    local_7e8 = local_608;
    uStack_7e0 = uStack_600;
    local_798 = CONCAT44(fStack_a4,local_a8);
    uStack_790 = CONCAT44(fStack_9c,fStack_a0);
    local_788 = local_108;
    uStack_780 = uStack_100;
    local_778 = CONCAT44(fStack_194,local_198);
    uStack_770 = CONCAT44(fStack_18c,fStack_190);
    local_768 = local_1f8;
    uStack_760 = uStack_1f0;
    local_698 = CONCAT44(fStack_5b4,local_5b8);
    uStack_690 = CONCAT44(fStack_5ac,fStack_5b0);
    local_688 = local_2e8;
    uStack_680 = uStack_2e0;
    local_678 = CONCAT44(fStack_374,local_378);
    uStack_670 = CONCAT44(fStack_36c,fStack_370);
    local_668 = local_3d8;
    uStack_660 = uStack_3d0;
    local_3c8 = local_348;
    uStack_3c0 = uStack_340;
    local_2d8 = local_258;
    uStack_2d0 = uStack_250;
    local_1e8 = local_168;
    uStack_1e0 = uStack_160;
    local_f8 = local_78;
    uStack_f0 = uStack_70;
    rtcTraversableForwardIntersect1
              (in_RDI,*(undefined8 *)(local_7d8 + 0x10),&local_838,
               *(undefined4 *)((long)in_RDI + 0x2c));
  }
  return;
}

Assistant:

RTC_SYCL_INDIRECTLY_CALLABLE void instanceIntersectFunc(const RTCIntersectFunctionNArguments* args)
{
  const int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  RTCRayHitN* rays = (RTCRayHitN*)args->rayhit;
  
  assert(args->N == 1);
  if (!valid[0])
    return;
  
  Ray *ray = (Ray*)rays;
  const Instance* instance = (const Instance*)ptr;
  const Vec3ff ray_org = ray->org;
  const Vec3ff ray_dir = ray->dir;
  const float ray_tnear = ray->tnear();
  const float ray_tfar  = ray->tfar;

#if 0

  RTCRayQueryContext* context = args->context;
  ray->org = Vec3ff(xfmPoint (instance->world2local,ray_org));
  ray->dir = Vec3ff(xfmVector(instance->world2local,ray_dir));
  ray->tnear() = ray_tnear;
  ray->tfar  = ray_tfar;
  pushInstanceId(context, args->geomID);
  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.context = context;
  rtcTraversableIntersect1(instance->object,RTCRayHit_(*ray),&args);
  popInstanceId(context);
  const float updated_tfar = ray->tfar;
  ray->org = ray_org;
  ray->dir = ray_dir;
  ray->tfar = updated_tfar;

#else
  
  RTCRay xray;
  const Vec3fa org = xfmPoint (instance->world2local,ray_org);
  const Vec3fa dir = xfmVector(instance->world2local,ray_dir);
  xray.org_x = org.x; xray.org_y = org.y; xray.org_z = org.z;
  xray.dir_x = dir.x; xray.dir_y = dir.y; xray.dir_z = dir.z;
  xray.tnear = ray_tnear;
  xray.tfar  = ray_tfar;
  xray.time = 0.0f;
  xray.mask = -1;
  xray.id = 0;
  xray.flags = 0;
  
  rtcTraversableForwardIntersect1(args,instance->object,&xray,args->geomID);
  
#endif
}